

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_primitive_field.cc
# Opt level: O1

void google::protobuf::compiler::cpp::anon_unknown_5::SetPrimitiveVariables
               (FieldDescriptor *descriptor,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables,Options *options)

{
  FieldDescriptor *pFVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *buffer;
  FieldDescriptor *pFVar2;
  bool bVar3;
  int iVar4;
  mapped_type *pmVar5;
  char *pcVar6;
  EnumDescriptor *descriptor_00;
  uint uVar7;
  undefined1 *field;
  undefined1 local_a8 [32];
  string local_88;
  undefined1 local_58 [32];
  FieldDescriptor *local_38;
  
  SetCommonFieldVariables(descriptor,variables,options);
  if (*(once_flag **)(descriptor + 0x30) != (once_flag *)0x0) {
    local_a8._0_8_ = FieldDescriptor::TypeOnceInit;
    local_58._0_8_ = descriptor;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(descriptor + 0x30),(_func_void_FieldDescriptor_ptr **)local_a8,
               (FieldDescriptor **)local_58);
  }
  field = FieldDescriptor::kTypeToCppTypeMap;
  PrimitiveTypeName_abi_cxx11_
            (&local_88,(cpp *)options,
             (Options *)
             (ulong)*(uint *)(FieldDescriptor::kTypeToCppTypeMap +
                             (ulong)*(uint *)(descriptor + 0x38) * 4),0x3e5b40);
  pFVar1 = (FieldDescriptor *)(local_a8 + 0x10);
  local_a8._0_8_ = pFVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"type","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_a8);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_88);
  if ((FieldDescriptor *)local_a8._0_8_ != pFVar1) {
    operator_delete((void *)local_a8._0_8_);
  }
  buffer = &local_88.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != buffer) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  DefaultValue_abi_cxx11_(&local_88,(cpp *)options,(Options *)descriptor,(FieldDescriptor *)field);
  local_a8._0_8_ = pFVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"default","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_a8);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_88);
  if ((FieldDescriptor *)local_a8._0_8_ != pFVar1) {
    operator_delete((void *)local_a8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != buffer) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  iVar4 = *(int *)(descriptor + 0x44);
  bVar3 = FieldDescriptor::is_packed(descriptor);
  uVar7 = 2;
  if (!bVar3) {
    if (*(once_flag **)(descriptor + 0x30) != (once_flag *)0x0) {
      local_58._0_8_ = FieldDescriptor::TypeOnceInit;
      local_38 = descriptor;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(descriptor + 0x30),(_func_void_FieldDescriptor_ptr **)local_58,
                 &local_38);
    }
    uVar7 = *(uint *)(internal::WireFormatLite::kWireTypeForFieldType +
                     (ulong)*(uint *)(descriptor + 0x38) * 4);
  }
  local_88._M_dataplus._M_p = (pointer)buffer;
  pcVar6 = FastUInt32ToBufferLeft(iVar4 << 3 | uVar7,buffer->_M_local_buf);
  local_88._M_string_length = (long)pcVar6 - (long)buffer;
  local_a8._0_8_ = pFVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a8,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  pFVar2 = (FieldDescriptor *)(local_58 + 0x10);
  local_58._0_8_ = pFVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"tag","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_58);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)local_a8);
  if ((FieldDescriptor *)local_58._0_8_ != pFVar2) {
    operator_delete((void *)local_58._0_8_);
  }
  if ((FieldDescriptor *)local_a8._0_8_ != pFVar1) {
    operator_delete((void *)local_a8._0_8_);
  }
  if (*(once_flag **)(descriptor + 0x30) != (once_flag *)0x0) {
    local_88._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_a8._0_8_ = descriptor;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(descriptor + 0x30),(_func_void_FieldDescriptor_ptr **)&local_88,
               (FieldDescriptor **)local_a8);
  }
  iVar4 = FixedSize(*(Type *)(descriptor + 0x38));
  if (iVar4 != -1) {
    local_88._M_dataplus._M_p = (pointer)buffer;
    pcVar6 = FastInt32ToBufferLeft(iVar4,buffer->_M_local_buf);
    local_88._M_string_length = (long)pcVar6 - (long)buffer;
    local_a8._0_8_ = pFVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a8,local_88._M_dataplus._M_p,
               local_88._M_dataplus._M_p + local_88._M_string_length);
    local_58._0_8_ = pFVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"fixed_size","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,(key_type *)local_58);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)local_a8);
    if ((FieldDescriptor *)local_58._0_8_ != pFVar2) {
      operator_delete((void *)local_58._0_8_);
    }
    if ((FieldDescriptor *)local_a8._0_8_ != pFVar1) {
      operator_delete((void *)local_a8._0_8_);
    }
  }
  if (*(once_flag **)(descriptor + 0x30) != (once_flag *)0x0) {
    local_88._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_a8._0_8_ = descriptor;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(descriptor + 0x30),(_func_void_FieldDescriptor_ptr **)&local_88,
               (FieldDescriptor **)local_a8);
  }
  iVar4 = *(int *)(descriptor + 0x38);
  descriptor_00 = FieldDescriptorProto_Type_descriptor();
  internal::NameOfEnum_abi_cxx11_(descriptor_00,iVar4);
  local_88._M_dataplus._M_p = (pointer)buffer;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"wire_format_field_type","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_88);
  std::__cxx11::string::_M_assign((string *)pmVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != buffer) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  local_88._M_dataplus._M_p = (pointer)buffer;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"full_name","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_88);
  std::__cxx11::string::_M_assign((string *)pmVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != buffer) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  return;
}

Assistant:

void SetPrimitiveVariables(const FieldDescriptor* descriptor,
                           std::map<std::string, std::string>* variables,
                           const Options& options) {
  SetCommonFieldVariables(descriptor, variables, options);
  (*variables)["type"] = PrimitiveTypeName(options, descriptor->cpp_type());
  (*variables)["default"] = DefaultValue(options, descriptor);
  (*variables)["tag"] = StrCat(internal::WireFormat::MakeTag(descriptor));
  int fixed_size = FixedSize(descriptor->type());
  if (fixed_size != -1) {
    (*variables)["fixed_size"] = StrCat(fixed_size);
  }
  (*variables)["wire_format_field_type"] = FieldDescriptorProto_Type_Name(
      static_cast<FieldDescriptorProto_Type>(descriptor->type()));
  (*variables)["full_name"] = descriptor->full_name();
}